

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
::update(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
         *this,char_range key)

{
  compact_bonsai_nlm<int,_64UL> *this_00;
  uint32_t uVar1;
  bool bVar2;
  undefined8 *puVar3;
  char *pcVar4;
  uint32_t uVar5;
  value_type_conflict7 *unaff_RBP;
  ulong uVar6;
  pair<const_int_*,_unsigned_long> pVar7;
  uint64_t node_id;
  char_range local_200;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
  local_1f0;
  
  local_200.end = key.end;
  local_200.begin = key.begin;
  if (local_200.begin == local_200.end) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00185a10;
    pcVar4 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_200.end[-1] == 0) {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map(&local_1f0,0,0x20);
          operator=(this,&local_1f0);
          ~map(&local_1f0);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        unaff_RBP = compact_bonsai_nlm<int,_64UL>::insert(&this->label_store_,1,&local_200);
      }
      else {
        local_1f0._0_8_ = 1;
        this_00 = &this->label_store_;
        do {
          if (local_200.begin == local_200.end) {
            pVar7 = compact_bonsai_nlm<int,_64UL>::compare(this_00,local_1f0._0_8_,&local_200);
            return pVar7.first;
          }
          pVar7 = compact_bonsai_nlm<int,_64UL>::compare(this_00,local_1f0._0_8_,&local_200);
          uVar6 = pVar7.second;
          if (pVar7.first == (value_type_conflict7 *)0x0) {
            local_200.begin = local_200.begin + uVar6;
            if (this->lambda_ <= uVar6) {
              do {
                bVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                                  (&this->hash_trie_,(uint64_t *)&local_1f0,0xff);
                if (bVar2) {
                  expand_if_needed_(this,(uint64_t *)&local_1f0);
                }
                uVar6 = uVar6 - this->lambda_;
              } while (this->lambda_ <= uVar6);
            }
            if ((this->codes_)._M_elems[*local_200.begin] == 0xff) {
              uVar1 = this->num_codes_;
              uVar5 = uVar1 + 1;
              this->num_codes_ = uVar5;
              (this->codes_)._M_elems[*local_200.begin] = (uchar)uVar1;
              if (uVar5 == 0xff) {
                puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
                *puVar3 = &PTR__exception_00185a10;
                pcVar4 = 
                "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
                ;
                goto LAB_0015ee87;
              }
            }
            bVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                              (&this->hash_trie_,(uint64_t *)&local_1f0,
                               uVar6 << 8 | (ulong)(this->codes_)._M_elems[*local_200.begin]);
            if (bVar2) {
              expand_if_needed_(this,(uint64_t *)&local_1f0);
              local_200.begin = local_200.begin + 1;
              this->size_ = this->size_ + 1;
              unaff_RBP = compact_bonsai_nlm<int,_64UL>::insert(this_00,local_1f0._0_8_,&local_200);
              bVar2 = false;
            }
            else {
              local_200.begin = local_200.begin + 1;
              bVar2 = true;
            }
          }
          else {
            bVar2 = false;
            unaff_RBP = pVar7.first;
          }
        } while (bVar2);
      }
      return unaff_RBP;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = &PTR__exception_00185a10;
    pcVar4 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_0015ee87:
  puVar3[1] = pcVar4;
  __cxa_throw(puVar3,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }